

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

void ClearMetadata(VP8LMetadata *hdr)

{
  WebPSafeFree(hdr->huffman_image_);
  VP8LHuffmanTablesDeallocate(&hdr->huffman_tables_);
  VP8LHtreeGroupsFree(hdr->htree_groups_);
  VP8LColorCacheClear(&hdr->color_cache_);
  VP8LColorCacheClear(&hdr->saved_color_cache_);
  (hdr->huffman_tables_).root.next = (HuffmanTablesSegment *)0x0;
  *(undefined8 *)&(hdr->huffman_tables_).root.size = 0;
  (hdr->huffman_tables_).root.start = (HuffmanCode *)0x0;
  (hdr->huffman_tables_).root.curr_table = (HuffmanCode *)0x0;
  *(undefined8 *)&hdr->num_htree_groups_ = 0;
  hdr->htree_groups_ = (HTreeGroup *)0x0;
  *(undefined8 *)&hdr->huffman_xsize_ = 0;
  hdr->huffman_image_ = (uint32_t *)0x0;
  (hdr->saved_color_cache_).hash_shift_ = 0;
  (hdr->saved_color_cache_).hash_bits_ = 0;
  hdr->huffman_mask_ = 0;
  hdr->huffman_subsample_bits_ = 0;
  (hdr->color_cache_).hash_shift_ = 0;
  (hdr->color_cache_).hash_bits_ = 0;
  (hdr->saved_color_cache_).colors_ = (uint32_t *)0x0;
  *(undefined8 *)hdr = 0;
  (hdr->color_cache_).colors_ = (uint32_t *)0x0;
  (hdr->huffman_tables_).curr_segment = (HuffmanTablesSegment *)0x0;
  return;
}

Assistant:

static void ClearMetadata(VP8LMetadata* const hdr) {
  assert(hdr != NULL);

  WebPSafeFree(hdr->huffman_image_);
  VP8LHuffmanTablesDeallocate(&hdr->huffman_tables_);
  VP8LHtreeGroupsFree(hdr->htree_groups_);
  VP8LColorCacheClear(&hdr->color_cache_);
  VP8LColorCacheClear(&hdr->saved_color_cache_);
  InitMetadata(hdr);
}